

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::MergeWireAssignmentsVisitor::create_new_assignment
               (Generator *generator,
               vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *stmts,Var *left,Var *right)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  pair<const_char_*,_int> pVar4;
  int local_c4;
  pair<const_char_*,_int> local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_a8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_a0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_98;
  const_iterator local_90;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_88;
  shared_ptr<kratos::AssignStmt> *stmt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3;
  enable_shared_from_this<kratos::Var> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::AssignStmt> new_stmt;
  Var *right_local;
  Var *left_local;
  vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *stmts_local;
  Generator *generator_local;
  
  new_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right;
  bVar1 = std::
          vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          ::empty(stmts);
  if (!bVar1) {
    std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_48);
    Var::assign((Var *)local_38,(shared_ptr<kratos::Var> *)left,(AssignmentType)&local_48);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_48);
    std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
              ((shared_ptr<kratos::Stmt> *)&__range3,(shared_ptr<kratos::AssignStmt> *)local_38);
    Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)&__range3);
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&__range3);
    if ((generator->debug & 1U) != 0) {
      __end3 = std::
               vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               ::begin(stmts);
      stmt = (shared_ptr<kratos::AssignStmt> *)
             std::
             vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end(stmts);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
                                         *)&stmt), bVar1) {
        local_88 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
                      ::operator*(&__end3);
        peVar3 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
        peVar2 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
        local_98._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::end(&(peVar2->super_Stmt).super_IRNode.fn_name_ln);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
        ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*>
                  ((__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)&local_90,&local_98);
        peVar2 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_88);
        local_a0._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::begin(&(peVar2->super_Stmt).super_IRNode.fn_name_ln);
        peVar2 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_88);
        local_a8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::end(&(peVar2->super_Stmt).super_IRNode.fn_name_ln);
        local_b0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)std::
                      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      ::
                      insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                                  *)&(peVar3->super_Stmt).super_IRNode.fn_name_ln,local_90,local_a0,
                                 (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                  )local_a8);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
        ::operator++(&__end3);
      }
      peVar3 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      local_c4 = 0x1e4;
      pVar4 = std::make_pair<char_const(&)[81],int>
                        ((char (*) [81])
                         "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                         ,&local_c4);
      local_c0.first = pVar4.first;
      local_c0.second = pVar4.second;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(peVar3->super_Stmt).super_IRNode.fn_name_ln,&local_c0);
    }
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_38);
  }
  return;
}

Assistant:

void static create_new_assignment(Generator* generator,
                                      const std::vector<std::shared_ptr<AssignStmt>>& stmts,
                                      Var* const left, Var* const right) {
        if (stmts.empty()) return;
        auto new_stmt = left->assign(right->shared_from_this(), AssignmentType::Blocking);
        generator->add_stmt(new_stmt);
        if (generator->debug) {
            // merge all the statements
            for (auto const& stmt : stmts) {
                new_stmt->fn_name_ln.insert(new_stmt->fn_name_ln.end(), stmt->fn_name_ln.begin(),
                                            stmt->fn_name_ln.end());
            }
            new_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }